

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

QLayoutItem * __thiscall QtMWidgets::ToolBarLayout::takeAt(ToolBarLayout *this,int index)

{
  qsizetype qVar1;
  QLayoutItem *pQVar2;
  QLayoutItem *item_2;
  QLayoutItem *item_1;
  QLayoutItem *item;
  int index_local;
  ToolBarLayout *this_local;
  
  if ((index < 0) || (qVar1 = QList<QLayoutItem_*>::size(&this->buttons), qVar1 + 2 <= (long)index))
  {
    return (QLayoutItem *)0x0;
  }
  if (index == 0) {
    pQVar2 = (QLayoutItem *)this->left;
    this->left = (QWidgetItem *)0x0;
    return pQVar2;
  }
  qVar1 = QList<QLayoutItem_*>::size(&this->buttons);
  if ((long)index == qVar1 + 1) {
    pQVar2 = (QLayoutItem *)this->right;
    this->right = (QWidgetItem *)0x0;
    return pQVar2;
  }
  pQVar2 = QList<QLayoutItem_*>::takeAt(&this->buttons,(long)(index + -1));
  return pQVar2;
}

Assistant:

QLayoutItem *
ToolBarLayout::takeAt( int index )
{
	if( index >= 0 && index < buttons.size() + 2 )
	{
		if( index == 0 )
		{
			QLayoutItem * item = left;
			left = 0;
			return item;
		}
		else if( index == buttons.size() + 1 )
		{
			QLayoutItem * item = right;
			right = 0;
			return item;
		}
		else
		{
			QLayoutItem * item = buttons.takeAt( index - 1 );
			return item;
		}
	}
	else
		return 0;
}